

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O2

int Ivy_FastMapArea_rec(Ivy_Man_t *pAig,Ivy_Obj_t *pObj,Vec_Vec_t *vLuts)

{
  char cVar1;
  int iVar2;
  long lVar3;
  Ivy_Obj_t *pObj_00;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  
  lVar7 = *(long *)((long)pAig->pData + 0x10);
  lVar3 = (long)*(int *)((long)pAig->pData + 8) * (long)pObj->Id;
  iVar5 = 0;
  if (*(char *)(lVar7 + 1 + lVar3) == '\0') {
    pcVar6 = (char *)(lVar7 + lVar3);
    cVar1 = *pcVar6;
    iVar5 = 0;
    if (cVar1 != '\x01') {
      pcVar6[1] = '\x01';
      iVar5 = 0;
      for (lVar7 = 0; lVar7 < cVar1; lVar7 = lVar7 + 1) {
        pObj_00 = Ivy_ManObj(pAig,*(int *)(pcVar6 + lVar7 * 4 + 0xc));
        iVar2 = Ivy_FastMapArea_rec(pAig,pObj_00,vLuts);
        iVar5 = iVar5 + iVar2;
        cVar1 = *pcVar6;
      }
      iVar2 = (int)*(short *)(pcVar6 + 8);
      if (vLuts->nSize <= iVar2) {
        Vec_PtrGrow((Vec_Ptr_t *)vLuts,iVar2 + 1);
        for (lVar7 = (long)vLuts->nSize; lVar7 <= iVar2; lVar7 = lVar7 + 1) {
          pVVar4 = Vec_PtrAlloc(0);
          vLuts->pArray[lVar7] = pVVar4;
        }
        vLuts->nSize = iVar2 + 1;
      }
      pVVar4 = Vec_VecEntry(vLuts,iVar2);
      Vec_PtrPush(pVVar4,pObj);
      iVar5 = iVar5 + 1;
    }
  }
  return iVar5;
}

Assistant:

int Ivy_FastMapArea_rec( Ivy_Man_t * pAig, Ivy_Obj_t * pObj, Vec_Vec_t * vLuts )
{
    Ivy_Supp_t * pSupp;
    int i, Counter;
    pSupp = Ivy_ObjSupp( pAig, pObj );
    // skip visited nodes and PIs
    if ( pSupp->fMark || pSupp->nSize == 1 )
        return 0;
    pSupp->fMark = 1;
    // compute the area of this node
    Counter = 0;
    for ( i = 0; i < pSupp->nSize; i++ )
        Counter += Ivy_FastMapArea_rec( pAig, Ivy_ManObj(pAig, pSupp->pArray[i]), vLuts );
    // add the node to the array of LUTs
    Vec_VecPush( vLuts, pSupp->Delay, pObj );
    return 1 + Counter;
}